

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlTextWriterWriteAttribute(void)

{
  int iVar1;
  int iVar2;
  xmlTextWriterPtr val;
  xmlChar *val_00;
  xmlChar *val_01;
  int local_44;
  int n_content;
  xmlChar *content;
  int n_name;
  xmlChar *name;
  int n_writer;
  xmlTextWriterPtr writer;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (name._4_4_ = 0; (int)name._4_4_ < 2; name._4_4_ = name._4_4_ + 1) {
    for (content._4_4_ = 0; (int)content._4_4_ < 5; content._4_4_ = content._4_4_ + 1) {
      for (local_44 = 0; local_44 < 5; local_44 = local_44 + 1) {
        iVar1 = xmlMemBlocks();
        val = gen_xmlTextWriterPtr(name._4_4_,0);
        val_00 = gen_const_xmlChar_ptr(content._4_4_,1);
        val_01 = gen_const_xmlChar_ptr(local_44,2);
        iVar2 = xmlTextWriterWriteAttribute(val,val_00,val_01);
        desret_int(iVar2);
        call_tests = call_tests + 1;
        des_xmlTextWriterPtr(name._4_4_,val,0);
        des_const_xmlChar_ptr(content._4_4_,val_00,1);
        des_const_xmlChar_ptr(local_44,val_01,2);
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextWriterWriteAttribute",
                 (ulong)(uint)(iVar2 - iVar1));
          ret_val = ret_val + 1;
          printf(" %d",(ulong)name._4_4_);
          printf(" %d",(ulong)content._4_4_);
          printf(" %d");
          printf("\n");
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlTextWriterWriteAttribute(void) {
    int test_ret = 0;

#if defined(LIBXML_WRITER_ENABLED)
    int mem_base;
    int ret_val;
    xmlTextWriterPtr writer; /* the xmlTextWriterPtr */
    int n_writer;
    const xmlChar * name; /* attribute name */
    int n_name;
    const xmlChar * content; /* attribute content */
    int n_content;

    for (n_writer = 0;n_writer < gen_nb_xmlTextWriterPtr;n_writer++) {
    for (n_name = 0;n_name < gen_nb_const_xmlChar_ptr;n_name++) {
    for (n_content = 0;n_content < gen_nb_const_xmlChar_ptr;n_content++) {
        mem_base = xmlMemBlocks();
        writer = gen_xmlTextWriterPtr(n_writer, 0);
        name = gen_const_xmlChar_ptr(n_name, 1);
        content = gen_const_xmlChar_ptr(n_content, 2);

        ret_val = xmlTextWriterWriteAttribute(writer, name, content);
        desret_int(ret_val);
        call_tests++;
        des_xmlTextWriterPtr(n_writer, writer, 0);
        des_const_xmlChar_ptr(n_name, name, 1);
        des_const_xmlChar_ptr(n_content, content, 2);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlTextWriterWriteAttribute",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_writer);
            printf(" %d", n_name);
            printf(" %d", n_content);
            printf("\n");
        }
    }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}